

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContainTest.h
# Opt level: O0

void __thiscall
oout::ContainTest::ContainTest<>(ContainTest *this,shared_ptr<const_oout::Text> *text,string *sub)

{
  undefined1 local_40 [16];
  shared_ptr<const_oout::Match> local_30;
  string *local_20;
  string *sub_local;
  shared_ptr<const_oout::Text> *text_local;
  ContainTest *this_local;
  
  local_20 = sub;
  sub_local = (string *)text;
  text_local = (shared_ptr<const_oout::Text> *)this;
  std::make_shared<oout::ContainMatch,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  std::shared_ptr<oout::Match_const>::shared_ptr<oout::ContainMatch,void>
            ((shared_ptr<oout::Match_const> *)&local_30,(shared_ptr<oout::ContainMatch> *)local_40);
  ContainTest(this,text,&local_30);
  std::shared_ptr<const_oout::Match>::~shared_ptr(&local_30);
  std::shared_ptr<oout::ContainMatch>::~shared_ptr((shared_ptr<oout::ContainMatch> *)local_40);
  return;
}

Assistant:

ContainTest(
		const std::shared_ptr<const Text> &text,
		const std::string &sub,
		S ... subs
	) : ContainTest(text, subs..., std::make_shared<ContainMatch>(sub))
	{
	}